

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
ZXing::Pdf417::ReadCodeWords<ZXing::PointT<double>>
          (BitMatrixCursor<ZXing::PointT<double>_> topCur,SymbolInfo info)

{
  int iVar1;
  bool bVar2;
  int __tmp;
  long lVar3;
  CodeWord CVar4;
  long lVar5;
  long lVar6;
  vector<int,_std::allocator<int>_> *in_RDI;
  ulong uVar7;
  double dVar8;
  undefined4 uVar10;
  undefined1 auVar9 [16];
  undefined4 uVar11;
  BitMatrix *in_stack_00000008;
  undefined1 in_stack_00000010 [16];
  double in_stack_00000020;
  double in_stack_00000028;
  int in_stack_00000034;
  int in_stack_00000038;
  int in_stack_0000003c;
  int in_stack_00000040;
  int in_stack_00000044;
  int in_stack_0000004c;
  float in_stack_00000050;
  allocator_type local_d1;
  ulong local_d0;
  vector<int,_std::allocator<int>_> *local_c8;
  float local_bc;
  int local_b8;
  int local_b4;
  long local_b0;
  undefined1 local_a8 [24];
  ulong local_90;
  BitMatrix *local_88;
  BitMatrixCursor<ZXing::PointT<double>_> local_80;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  iVar1 = in_stack_00000040;
  local_a8._8_8_ = in_stack_00000028;
  local_a8._0_8_ = in_stack_00000020;
  if (in_stack_00000044 < in_stack_00000040) {
    dVar8 = in_stack_00000020 * (double)(in_stack_00000034 + -1) + (double)in_stack_00000010._8_8_;
    in_stack_00000010._8_4_ = SUB84(dVar8,0);
    in_stack_00000010._0_8_ =
         (double)in_stack_00000010._0_8_ - in_stack_00000028 * (double)(in_stack_00000034 + -1);
    in_stack_00000010._12_4_ = (int)((ulong)dVar8 >> 0x20);
    dStack_50 = -in_stack_00000020;
    in_stack_00000040 = in_stack_00000044;
    in_stack_00000044 = iVar1;
    local_58 = in_stack_00000028;
  }
  else {
    local_58 = -in_stack_00000028;
    dStack_50 = in_stack_00000020;
  }
  local_d0 = (ulong)in_stack_0000003c;
  local_80.img = (BitMatrix *)CONCAT44(local_80.img._4_4_,0xffffffff);
  local_c8 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector
            (in_RDI,(long)(in_stack_0000003c * in_stack_00000038),(value_type_conflict3 *)&local_80,
             &local_d1);
  lVar3 = (long)in_stack_00000040;
  local_b4 = in_stack_00000044 + 1;
  if (in_stack_00000038 <= in_stack_00000044 + 1) {
    local_b4 = in_stack_00000038;
  }
  if (in_stack_00000040 < local_b4) {
    local_b8 = (in_stack_0000004c * 3) / 2;
    local_90 = local_d0 & 0xffffffff;
    local_bc = in_stack_00000050;
    local_88 = in_stack_00000008;
    local_48 = (double)in_stack_00000010._0_8_;
    dStack_40 = (double)in_stack_00000010._8_8_;
    auVar9 = _DAT_001942a0 & local_a8._0_16_;
    uVar10 = auVar9._8_4_;
    uVar11 = auVar9._12_4_;
    if (auVar9._8_8_ <= auVar9._0_8_) {
      uVar10 = auVar9._0_4_;
      uVar11 = auVar9._4_4_;
    }
    auVar9._4_4_ = uVar11;
    auVar9._0_4_ = uVar10;
    auVar9._8_4_ = uVar10;
    auVar9._12_4_ = uVar11;
    local_a8._0_16_ = divpd(local_a8._0_16_,auVar9);
    lVar5 = lVar3 * local_d0;
    local_b0 = lVar3;
    do {
      dVar8 = (double)(int)(((float)((int)lVar3 - (int)local_b0) + 0.5) * local_bc);
      local_80.img = local_88;
      local_80.p.x = dVar8 * local_58 + local_48;
      local_80.p.y = dVar8 * dStack_50 + dStack_40;
      local_80.d.x = (double)local_a8._0_8_;
      local_80.d.y = (double)local_a8._8_8_;
      bVar2 = BitMatrixCursor<ZXing::PointT<double>_>::isWhite(&local_80);
      BitMatrixCursor<ZXing::PointT<double>_>::stepToEdge(&local_80,bVar2 | 8,local_b8,false);
      iVar1 = ((int)lVar3 % 3) * 3;
      ReadCodeWord<ZXing::PointT<double>>(&local_80,iVar1);
      lVar6 = lVar5;
      uVar7 = local_90;
      if (0 < (int)local_d0) {
        do {
          if ((((local_80.p.x < 0.0) || ((double)(local_80.img)->_width <= local_80.p.x)) ||
              (local_80.p.y < 0.0)) || ((double)(local_80.img)->_height <= local_80.p.y)) break;
          CVar4 = ReadCodeWord<ZXing::PointT<double>>(&local_80,iVar1);
          (local_c8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[lVar6] = CVar4.code;
          uVar7 = uVar7 - 1;
          lVar6 = lVar6 + 1;
        } while (uVar7 != 0);
      }
      lVar3 = lVar3 + 1;
      lVar5 = lVar5 + local_d0;
    } while (local_b4 != (int)lVar3);
  }
  return local_c8;
}

Assistant:

std::vector<int> ReadCodeWords(BitMatrixCursor<POINT> topCur, SymbolInfo info)
{
	printf("rows: %d, cols: %d, rowHeight: %.1f, colWidth: %d, firstRow: %d, lastRow: %d, ecLevel: %d\n", info.nRows,
		   info.nCols, info.rowHeight, info.colWidth, info.firstRow, info.lastRow, info.ecLevel);
	auto print = [](CodeWord c [[maybe_unused]]) { printf("%4d.%d ", c.code, c.cluster); };

	auto rowSkip = topCur.right();
	if (info.firstRow > info.lastRow) {
		topCur.p += (info.height - 1) * rowSkip;
		rowSkip = -rowSkip;
		std::swap(info.firstRow, info.lastRow);
	}

	int maxColWidth = info.colWidth * 3 / 2;
	std::vector<int> codeWords(info.nRows * info.nCols, -1);
	for (int row = info.firstRow; row < std::min(info.nRows, info.lastRow + 1); ++row) {
		int cluster = (row % 3) * 3;
		auto cur = topCur.movedBy(int((row - info.firstRow + 0.5f) * info.rowHeight) * rowSkip);
		// skip start pattern
		cur.stepToEdge(8 + cur.isWhite(), maxColWidth);
		// read off left row indicator column
		auto cw [[maybe_unused]] = ReadCodeWord(cur, cluster);
		printf("%3dx%3d:%2d: ", int(cur.p.x), int(cur.p.y), Row(cw));
		print(cw);

		for (int col = 0; col < info.nCols && cur.isIn(); ++col) {
			auto cw = ReadCodeWord(cur, cluster);
			codeWords[row * info.nCols + col] = cw.code;
			print(cw);
		}

#ifdef PRINT_DEBUG
		print(ReadCodeWord(cur));
		printf("\n");
		fflush(stdout);
#endif
	}

	return codeWords;
}